

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::InteractionArgumentAliasing3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionArgumentAliasing3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  iterator iVar2;
  TestError *this_00;
  long lVar3;
  _Base_ptr *__lhs;
  string verification;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  long local_f8;
  string iteration_loop_start;
  string function_use;
  string function_definition;
  string iteration_loop_end;
  string array_declaration;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iteration_loop_end,
             "                               }\n                           }\n                        }\n                    }\n                }\n            }\n        }\n    }\n"
             ,(allocator<char> *)&iteration_loop_start);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iteration_loop_start,
             "    for (uint a = 0u; a < 2u; a++)\n    {\n        for (uint b = 0u; b < 2u; b++)\n        {\n            for (uint c = 0u; c < 2u; c++)\n            {\n                for (uint d = 0u; d < 2u; d++)\n                {\n                    for (uint e = 0u; e < 2u; e++)\n                    {\n                        for (uint f = 0u; f < 2u; f++)\n                        {\n                           for (uint g = 0u; g < 2u; g++)\n                           {\n                               for (uint h = 0u; h < 2u; h++)\n                               {\n"
             ,(allocator<char> *)&array_declaration);
  lVar3 = 0;
  do {
    if (lVar3 == 0x14) {
      std::__cxx11::string::~string((string *)&iteration_loop_start);
      std::__cxx11::string::~string((string *)&iteration_loop_end);
      return;
    }
    local_f8 = lVar3;
    iVar2 = std::
            _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
            ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                    *)supported_variable_types_map,
                   (key_type *)((long)test_shader_compilation::var_types_set_gl + lVar3));
    if (iVar2._M_node == (_Base_ptr)(supported_variable_types_map + 8)) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1654);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    __lhs = &iVar2._M_node[1]._M_parent;
    std::operator+(&array_declaration,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   " z[2][2][2][2][2][2][2][2];\n\n");
    function_definition._M_dataplus._M_p = (pointer)&function_definition.field_2;
    function_definition._M_string_length = 0;
    function_use._M_dataplus._M_p = (pointer)&function_use.field_2;
    function_use._M_string_length = 0;
    function_definition.field_2._M_local_buf[0] = '\0';
    function_use.field_2._M_local_buf[0] = '\0';
    verification._M_dataplus._M_p = (pointer)&verification.field_2;
    verification._M_string_length = 0;
    verification.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_50,"bool gfunc(out ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
    std::operator+(&local_118,&local_50," x[2][2][2][2][2][2][2][2], ");
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   " y[2][2][2][2][2][2][2][2])\n");
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)&function_definition);
    std::operator+(&local_118,"    ",&iteration_loop_start);
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::~string((string *)&local_118);
    std::operator+(&local_50,"                                   x[a][b][c][d][e][f][g][h] = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
    std::operator+(&local_118,&local_50,"(123);\n");
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator+(&local_118,"    ",&iteration_loop_end);
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)&function_definition);
    std::operator+(&local_118,"    ",&iteration_loop_start);
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)&function_definition);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"mat4");
    if (bVar1) {
      std::__cxx11::string::append((char *)&function_definition);
LAB_00b9c6a8:
      std::__cxx11::string::append((char *)&function_definition);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"dmat4");
      if (bVar1) {
        std::__cxx11::string::append((char *)&function_definition);
        goto LAB_00b9c6a8;
      }
      std::__cxx11::string::append((char *)&function_definition);
      std::__cxx11::string::append((string *)&function_definition);
    }
    std::__cxx11::string::append((char *)&function_definition);
    std::operator+(&local_118,"    ",&iteration_loop_end);
    std::__cxx11::string::append((string *)&function_definition);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)&function_definition);
    std::__cxx11::string::append((char *)&function_definition);
    std::operator+(&local_118,"    ",&array_declaration);
    std::__cxx11::string::append((string *)&function_use);
    std::__cxx11::string::~string((string *)&local_118);
    std::operator+(&local_118,"    ",&iteration_loop_start);
    std::__cxx11::string::append((string *)&function_use);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)&function_use);
    std::__cxx11::string::append((string *)&function_use);
    std::__cxx11::string::append((char *)&function_use);
    std::operator+(&local_118,"    ",&iteration_loop_end);
    std::__cxx11::string::append((string *)&function_use);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)&verification);
    std::__cxx11::string::append((char *)&verification);
    std::__cxx11::string::append((char *)&verification);
    std::__cxx11::string::append((char *)&verification);
    std::__cxx11::string::append((char *)&verification);
    std::__cxx11::string::append((char *)&verification);
    std::__cxx11::string::append((char *)&verification);
    std::__cxx11::string::append((char *)&verification);
    std::__cxx11::string::append((char *)&verification);
    if (tested_shader_type == COMPUTE_SHADER_TYPE) {
      InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_dispatch_test
                (&this->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 COMPUTE_SHADER_TYPE,&function_definition,&function_use,&verification);
    }
    else {
      InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test
                (&this->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 tested_shader_type,&function_definition,&function_use,&verification);
    }
    (*(this->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])();
    std::__cxx11::string::~string((string *)&verification);
    std::__cxx11::string::~string((string *)&function_use);
    std::__cxx11::string::~string((string *)&function_definition);
    std::__cxx11::string::~string((string *)&array_declaration);
    lVar3 = local_f8 + 4;
  } while( true );
}

Assistant:

void InteractionArgumentAliasing3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4 };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4,
															 VAR_TYPE_DOUBLE, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string iteration_loop_end = "                               }\n"
										   "                           }\n"
										   "                        }\n"
										   "                    }\n"
										   "                }\n"
										   "            }\n"
										   "        }\n"
										   "    }\n";
	const std::string iteration_loop_start = "    for (uint a = 0u; a < 2u; a++)\n"
											 "    {\n"
											 "        for (uint b = 0u; b < 2u; b++)\n"
											 "        {\n"
											 "            for (uint c = 0u; c < 2u; c++)\n"
											 "            {\n"
											 "                for (uint d = 0u; d < 2u; d++)\n"
											 "                {\n"
											 "                    for (uint e = 0u; e < 2u; e++)\n"
											 "                    {\n"
											 "                        for (uint f = 0u; f < 2u; f++)\n"
											 "                        {\n"
											 "                           for (uint g = 0u; g < 2u; g++)\n"
											 "                           {\n"
											 "                               for (uint h = 0u; h < 2u; h++)\n"
											 "                               {\n";
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;
	const bool					test_compute  = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string array_declaration = var_iterator->second.type + " z[2][2][2][2][2][2][2][2];\n\n";

			std::string function_definition;
			std::string function_use;
			std::string verification;

			function_definition += "bool gfunc(out " + var_iterator->second.type + " x[2][2][2][2][2][2][2][2], ";
			function_definition += var_iterator->second.type + " y[2][2][2][2][2][2][2][2])\n";
			function_definition += "{\n";
			function_definition += "    " + iteration_loop_start;
			function_definition +=
				"                                   x[a][b][c][d][e][f][g][h] = " + var_iterator->second.type +
				"(123);\n";
			function_definition += "    " + iteration_loop_end;
			function_definition += "\n";
			function_definition += "    " + iteration_loop_start;
			function_definition += "                                   if(y[a][b][c][d][e][f][g][h]";
			if (var_iterator->second.type == "mat4") // mat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != float";
			}
			else if (var_iterator->second.type == "dmat4") // dmat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != double";
			}
			else
			{
				function_definition += " != ";
				function_definition += var_iterator->second.type;
			}
			function_definition += "(((a*128u)+(b*64u)+(c*32u)+(d*16u)+(e*8u)+(f*4u)+(g*2u)+h))) {return false;}\n";
			function_definition += "    " + iteration_loop_end;
			function_definition += "  return true;\n";
			function_definition += "}\n\n";

			function_use += "    " + array_declaration;
			function_use += "    " + iteration_loop_start;
			function_use += "                                   z[a][b][c][d][e][f][g][h] = ";
			function_use += var_iterator->second.type;
			function_use += "(((a*128u)+(b*64u)+(c*32u)+(d*16u)+(e*8u)+(f*4u)+(g*2u)+h));\n";
			function_use += "    " + iteration_loop_end;

			verification += "    float result = 0.0;\n";
			verification += "    if(gfunc(z, z) == true)\n";
			verification += "    {\n";
			verification += "        result = 1.0;\n\n";
			verification += "    }\n";
			verification += "    else\n";
			verification += "    {\n";
			verification += "        result = 0.0;\n\n";
			verification += "    }\n";

			if (false == test_compute)
			{
				this->execute_draw_test(tested_shader_type, function_definition, function_use, verification);
			}
			else
			{
				this->execute_dispatch_test(tested_shader_type, function_definition, function_use, verification);
			}

			/* Deallocate any resources used. */
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}